

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

ssize_t fio_read(intptr_t uuid,void *buffer,size_t count)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  code *pcVar4;
  int *piVar5;
  uint uVar6;
  long lVar7;
  fio_lock_i ret;
  
  if ((((uuid < 0) || (uVar6 = (uint)((ulong)uuid >> 8), fio_data->capa <= uVar6)) ||
      (lVar7 = (long)(int)uVar6 * 0xa8, *(char *)((long)fio_data + lVar7 + 0x6d) != (char)uuid)) ||
     (*(char *)((long)fio_data + lVar7 + 0x6f) == '\0')) {
    piVar5 = __errno_location();
    *piVar5 = 9;
    return -1;
  }
  if (count != 0) {
    fio_lock((fio_lock_i *)((long)fio_data + lVar7 + 0x6e));
    uVar3 = *(undefined8 *)((long)fio_data + lVar7 + 0xb0);
    pcVar4 = (code *)**(undefined8 **)((long)fio_data + lVar7 + 0xa8);
    LOCK();
    *(undefined1 *)((long)fio_data + lVar7 + 0x6e) = 0;
    UNLOCK();
    piVar5 = __errno_location();
    iVar1 = *piVar5;
    do {
      lVar7 = (*pcVar4)(uuid,uVar3,buffer,count);
      if (0 < lVar7) {
        fio_touch(uuid);
        return lVar7;
      }
      if (-1 < lVar7) goto LAB_00106fd3;
      iVar2 = *piVar5;
    } while (iVar2 == 4);
    if ((iVar2 != 0x6b) && (iVar2 != 0xb)) {
LAB_00106fd3:
      fio_force_close(uuid);
      return -1;
    }
    *piVar5 = iVar1;
  }
  return 0;
}

Assistant:

ssize_t fio_read(intptr_t uuid, void *buffer, size_t count) {
  if (!uuid_is_valid(uuid) || !uuid_data(uuid).open) {
    errno = EBADF;
    return -1;
  }
  if (count == 0)
    return 0;
  fio_lock(&uuid_data(uuid).sock_lock);
  ssize_t (*rw_read)(intptr_t, void *, void *, size_t) =
      uuid_data(uuid).rw_hooks->read;
  void *udata = uuid_data(uuid).rw_udata;
  fio_unlock(&uuid_data(uuid).sock_lock);
  int old_errno = errno;
  ssize_t ret;
retry_int:
  ret = rw_read(uuid, udata, buffer, count);
  if (ret > 0) {
    fio_touch(uuid);
    return ret;
  }
  if (ret < 0 && errno == EINTR)
    goto retry_int;
  if (ret < 0 &&
      (errno == EWOULDBLOCK || errno == EAGAIN || errno == ENOTCONN)) {
    errno = old_errno;
    return 0;
  }
  fio_force_close(uuid);
  return -1;
}